

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O1

int __thiscall
CVmObjByteArray::getp_read_int(CVmObjByteArray *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  uint *buf;
  size_t len;
  uchar cbuf [4];
  uint local_2c;
  
  if (getp_read_int(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_read_int();
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,argc,&getp_read_int::desc);
  if (iVar1 == 0) {
    uVar2 = CVmBif::pop_int_val();
    uVar3 = CVmBif::pop_int_val();
    len = 4;
    if ((uVar3 & 0xf) != 2) {
      len = (ulong)((uVar3 & 0xf) == 1) + 1;
    }
    if ((uVar2 == 0) || ((ulong)*(uint *)(this->super_CVmObject).ext_ < (uVar2 + len) - 1)) {
      err_throw(0x7df);
    }
    buf = &local_2c;
    copy_to_buf(this,(uchar *)buf,(ulong)uVar2,len);
    if (len == 4) {
      uVar2 = local_2c;
      if ((uVar3 & 0xf0) == 0x10) {
        lVar4 = 3;
        do {
          uVar2 = *buf;
          *(uchar *)buf = *(uchar *)((long)&local_2c + lVar4);
          *(uchar *)((long)&local_2c + lVar4) = (uchar)uVar2;
          lVar4 = lVar4 + -1;
          buf = (uint *)((long)buf + 1);
          uVar2 = local_2c;
        } while (lVar4 != 1);
      }
    }
    else if ((int)len == 2) {
      if ((uVar3 & 0xf0) == 0x10) {
        local_2c = (uint)(ushort)((ushort)local_2c << 8 | (ushort)local_2c >> 8);
      }
      uVar2 = (int)(short)(ushort)local_2c;
      if ((uVar3 & 0xf00) != 0) {
        uVar2 = local_2c & 0xffff;
      }
    }
    else {
      uVar2 = 0;
      if ((int)len == 1) {
        uVar2 = (int)(char)local_2c;
        if ((uVar3 & 0xf00) != 0) {
          uVar2 = local_2c & 0xff;
        }
      }
    }
    retval->typ = VM_INT;
    (retval->val).obj = uVar2;
  }
  return 1;
}

Assistant:

int CVmObjByteArray::getp_read_int(VMG_ vm_obj_id_t self,
                                   vm_val_t *retval, uint *argc)
{
    static CVmNativeCodeDesc desc(2);
    unsigned int idx;
    unsigned int fmt;
    long result = 0;
    size_t siz;
    unsigned char cbuf[4];

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the starting index and format code */
    idx = CVmBif::pop_int_val(vmg0_);
    fmt = CVmBif::pop_int_val(vmg0_);

    /* get the size from the format */
    switch (fmt & FmtSizeMask)
    {
    case FmtInt8:
    default:
        siz = 1;
        break;

    case FmtInt16:
        siz = 2;
        break;

    case FmtInt32:
        siz = 4;
        break;
    }

    /* check that the index is in range */
    if (idx < 1 || idx + siz - 1 > get_element_count())
        err_throw(VMERR_INDEX_OUT_OF_RANGE);

    /* make a copy of the bytes in cbuf[] for easy access */
    copy_to_buf(cbuf, idx, siz);

    /* read the value */
    switch (siz)
    {
    case 1:
        /* 8-bit integer - all that matters is the signedness */
        if ((fmt & FmtSignedMask) == FmtSigned)
            result = (long)(int)(char)cbuf[0];
        else
            result = cbuf[0];
        break;

    case 2:
        /* 
         *   16-bit integer.  Our standard portable order is little-endian,
         *   so swap bytes if it's big-endian.  
         */
        if ((fmt & FmtOrderMask) == FmtBigEndian)
            swap_bytes(cbuf, 2);

        /* it's little-endian now, so pull out the signed or unsigned value */
        if ((fmt & FmtSignedMask) == FmtSigned)
            result = osrp2s(cbuf);
        else
            result = osrp2(cbuf);

        break;

    case 4:
        /* 
         *   32-bit integer.  Convert to our standard little-endian ordering
         *   if it's currently big-endian, by swapping the byte order.
         */
        if ((fmt & FmtOrderMask) == FmtBigEndian)
            swap_bytes(cbuf, 4);

        /* it's little-endian now, so pull out the signed or unsigned value */
        if ((fmt & FmtSignedMask) == FmtSigned)
            result = osrp4s(cbuf);
        else
            result = osrp4(cbuf);
        break;
    }

    /* return the result */
    retval->set_int(result);

    /* handled */
    return TRUE;
}